

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O2

ssize_t compress_out(archive_write *a,void *buff,size_t s,la_zaction run)

{
  void *buff_00;
  void *pvVar1;
  long lVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ulong s_00;
  bool bVar7;
  
  pvVar1 = a->format_data;
  if ((run == ARCHIVE_Z_FINISH) && (*(long *)((long)pvVar1 + 0xa0) == 0 && s == 0)) {
    sVar6 = 0;
  }
  else {
    if ((s != 0) && ((*(uint *)((long)pvVar1 + 0x7c) & 1) != 0)) {
      uVar3 = crc32(*(undefined4 *)((long)pvVar1 + 0x74),buff,s & 0xffffffff);
      *(undefined4 *)((long)pvVar1 + 0x74) = uVar3;
    }
    *(void **)((long)pvVar1 + 0x90) = buff;
    *(size_t *)((long)pvVar1 + 0x98) = s;
    buff_00 = (void *)((long)pvVar1 + 0x110);
LAB_0015e113:
    do {
      if (*(int *)((long)pvVar1 + 0xd0) == 0) {
        bVar7 = true;
      }
      else {
        uVar4 = (**(code **)((long)pvVar1 + 0xe0))(a,(long)pvVar1 + 0x90,run);
        bVar7 = uVar4 != 1;
        if (1 < uVar4) {
          return -0x1e;
        }
      }
      if (*(long *)((long)pvVar1 + 0xb0) == 0) {
        iVar5 = write_to_temp(a,buff_00,0xf000);
        if (iVar5 != 0) {
          return -0x1e;
        }
        *(void **)((long)pvVar1 + 0xa8) = buff_00;
        *(undefined8 *)((long)pvVar1 + 0xb0) = 0xf000;
        if ((*(byte *)((long)pvVar1 + 0x7c) & 2) != 0) {
          uVar3 = crc32(*(undefined4 *)((long)pvVar1 + 0x78),buff_00,0xf000);
          *(undefined4 *)((long)pvVar1 + 0x78) = uVar3;
        }
        if ((bool)(run == ARCHIVE_Z_FINISH & bVar7)) goto LAB_0015e113;
      }
    } while (*(long *)((long)pvVar1 + 0x98) != 0);
    sVar6 = s;
    if (run == ARCHIVE_Z_FINISH) {
      lVar2 = *(long *)((long)pvVar1 + 0xb0);
      s_00 = 0xf000 - lVar2;
      iVar5 = write_to_temp(a,buff_00,s_00);
      sVar6 = 0xffffffffffffffe2;
      if (((iVar5 == 0) && (sVar6 = s, lVar2 != 0xf000)) &&
         ((*(uint *)((long)pvVar1 + 0x7c) & 2) != 0)) {
        uVar3 = crc32(*(undefined4 *)((long)pvVar1 + 0x78),buff_00,s_00 & 0xffffffff);
        *(undefined4 *)((long)pvVar1 + 0x78) = uVar3;
      }
    }
  }
  return sVar6;
}

Assistant:

static ssize_t
compress_out(struct archive_write *a, const void *buff, size_t s,
    enum la_zaction run)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	int r;

	if (run == ARCHIVE_Z_FINISH && zip->stream.total_in == 0 && s == 0)
		return (0);

	if ((zip->crc32flg & PRECODE_CRC32) && s)
		zip->precode_crc32 = crc32(zip->precode_crc32, buff,
		    (unsigned)s);
	zip->stream.next_in = (const unsigned char *)buff;
	zip->stream.avail_in = s;
	for (;;) {
		/* Compress file data. */
		r = compression_code(&(a->archive), &(zip->stream), run);
		if (r != ARCHIVE_OK && r != ARCHIVE_EOF)
			return (ARCHIVE_FATAL);
		if (zip->stream.avail_out == 0) {
			if (write_to_temp(a, zip->wbuff, sizeof(zip->wbuff))
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			zip->stream.next_out = zip->wbuff;
			zip->stream.avail_out = sizeof(zip->wbuff);
			if (zip->crc32flg & ENCODED_CRC32)
				zip->encoded_crc32 = crc32(zip->encoded_crc32,
				    zip->wbuff, sizeof(zip->wbuff));
			if (run == ARCHIVE_Z_FINISH && r != ARCHIVE_EOF)
				continue;
		}
		if (zip->stream.avail_in == 0)
			break;
	}
	if (run == ARCHIVE_Z_FINISH) {
		uint64_t bytes = sizeof(zip->wbuff) - zip->stream.avail_out;
		if (write_to_temp(a, zip->wbuff, (size_t)bytes) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		if ((zip->crc32flg & ENCODED_CRC32) && bytes)
			zip->encoded_crc32 = crc32(zip->encoded_crc32,
			    zip->wbuff, (unsigned)bytes);
	}

	return (s);
}